

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O2

variable_order_t * __thiscall
merlin::graphical_model::order2
          (variable_order_t *__return_storage_ptr__,graphical_model *this,OrderMethod ord_type,
          vector<bool,_std::allocator<bool>_> *var_types)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  unsigned_long uVar3;
  size_t v;
  pointer pmVar4;
  int iVar5;
  index *piVar6;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  size_t i;
  index *piVar10;
  pointer peVar11;
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  *this_00;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *p_Var12;
  long lVar13;
  const_iterator ci;
  pointer pvVar14;
  index *piVar15;
  reference rVar16;
  size_t cand;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> neighbors;
  vector<unsigned_long,_std::allocator<unsigned_long>_> candidates;
  vector<int,_std::allocator<int>_> scores;
  vector<unsigned_long,_std::allocator<unsigned_long>_> simplicial;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> to_fix;
  my_set<merlin::edge_id> nlist;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> sum_vars;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> map_vars;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> adj;
  graph G;
  int local_27c;
  index *local_278;
  unsigned_long local_270;
  variable_order_t *local_268;
  OrderMethod local_25c;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_258;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_228;
  _Vector_base<int,_std::allocator<int>_> local_210;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_1f8;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_1d8;
  vector<bool,_std::allocator<bool>_> *local_1a8;
  graphical_model *local_1a0;
  my_set<merlin::edge_id> local_198;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_178;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_148;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> local_118;
  graph local_100;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268 = __return_storage_ptr__;
  local_25c.t_ = ord_type.t_;
  graph::graph(&local_100,
               (long)(this->m_vadj).
                     super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_vadj).
                     super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
  mrf(&local_118,this);
  for (piVar6 = (index *)0x0;
      local_278 = (index *)((long)(this->m_vadj).
                                  super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_vadj).
                                  super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5),
      piVar6 < local_278; piVar6 = (index *)((long)piVar6 + 1)) {
    pvVar14 = local_118.
              super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
              _M_impl.super__Vector_impl_data._M_start + (long)piVar6;
    for (lVar13 = 0;
        puVar2 = (pvVar14->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        lVar13 != (long)(pvVar14->m_v).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar2 >> 3; lVar13 = lVar13 + 1)
    {
      graph::add_edge(&local_100,(index)piVar6,puVar2[lVar13]);
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (local_268,(size_type)local_278);
  local_178._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_178._M_impl.super__Rb_tree_header._M_header;
  local_178._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_178._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_148._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_148._M_impl.super__Rb_tree_header._M_header;
  local_148._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_148._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_148._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_178._M_impl.super__Rb_tree_header._M_header._M_right =
       local_178._M_impl.super__Rb_tree_header._M_header._M_left;
  local_148._M_impl.super__Rb_tree_header._M_header._M_right =
       local_148._M_impl.super__Rb_tree_header._M_header._M_left;
  for (local_258._M_impl._0_8_ = (index *)0x0; (ulong)local_258._M_impl._0_8_ < local_278;
      local_258._M_impl._0_8_ = local_258._M_impl._0_8_ + 1) {
    rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](var_types,local_258._M_impl._0_8_)
    ;
    this_00 = (_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
               *)&local_178;
    if ((*rVar16._M_p & rVar16._M_mask) != 0) {
      this_00 = (_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                 *)&local_148;
    }
    std::
    _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
    ::_M_insert_unique<unsigned_long_const&>(this_00,(unsigned_long *)&local_258);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_210,(size_type)local_278,
             (allocator_type *)&local_258);
  for (piVar6 = (index *)0x0; local_278 != piVar6; piVar6 = (index *)((long)piVar6 + 1)) {
    iVar5 = order_score(this,&local_100,(size_t)piVar6,local_25c);
    local_210._M_impl.super__Vector_impl_data._M_start[(long)piVar6] = iVar5;
  }
  p_Var1 = &local_258._M_impl.super__Rb_tree_header;
  local_1a8 = var_types;
  local_1a0 = this;
  do {
    if ((int)local_278 == 0) break;
    local_228._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_228._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_228._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1f8._M_impl.super__Vector_impl_data._M_start = (index *)0x0;
    local_1f8._M_impl.super__Vector_impl_data._M_finish = (index *)0x0;
    p_Var12 = &local_178;
    if (local_178._M_impl.super__Rb_tree_header._M_node_count == 0) {
      p_Var12 = &local_148;
    }
    p_Var7 = (p_Var12->_M_impl).super__Rb_tree_header._M_header._M_left;
    p_Var12 = &local_178;
    if (local_178._M_impl.super__Rb_tree_header._M_node_count == 0) {
      p_Var12 = &local_148;
    }
    local_27c = 0x7fffffff;
    for (; piVar6 = local_1f8._M_impl.super__Vector_impl_data._M_start,
        (_Rb_tree_header *)p_Var7 != &(p_Var12->_M_impl).super__Rb_tree_header;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      piVar6 = (index *)(long)(int)p_Var7[1]._M_color;
      iVar5 = local_210._M_impl.super__Vector_impl_data._M_start[(long)piVar6];
      if (iVar5 == 0) {
        local_258._M_impl._0_8_ = piVar6;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1f8,
                   (unsigned_long *)&local_258);
      }
      else if (iVar5 < local_27c) {
        if (local_228._M_impl.super__Vector_impl_data._M_finish !=
            local_228._M_impl.super__Vector_impl_data._M_start) {
          local_228._M_impl.super__Vector_impl_data._M_finish =
               local_228._M_impl.super__Vector_impl_data._M_start;
        }
        local_258._M_impl._0_8_ = piVar6;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_228,
                   (unsigned_long *)&local_258);
        local_27c = iVar5;
      }
      else if (iVar5 == local_27c) {
        local_258._M_impl._0_8_ = piVar6;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_228,
                   (unsigned_long *)&local_258);
      }
    }
    for (; piVar6 != local_1f8._M_impl.super__Vector_impl_data._M_finish; piVar6 = piVar6 + 1) {
      local_1d8._M_impl._0_8_ = *piVar6;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (local_268,(value_type_conflict1 *)&local_1d8);
      my_set<merlin::edge_id>::my_set
                ((my_set<merlin::edge_id> *)&local_258,
                 local_100.m_adj.
                 super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + local_1d8._M_impl._0_8_);
      local_278 = (index *)(ulong)((int)local_278 - 1);
      for (piVar15 = (index *)local_258._M_impl._0_8_;
          piVar15 !=
          (index *)CONCAT44(local_258._M_impl.super__Rb_tree_header._M_header._4_4_,
                            local_258._M_impl.super__Rb_tree_header._M_header._M_color);
          piVar15 = piVar15 + 4) {
        graph::remove_edge(&local_100,*piVar15,piVar15[1]);
      }
      graph::remove_node(&local_100,local_1d8._M_impl._0_8_);
      local_210._M_impl.super__Vector_impl_data._M_start[local_1d8._M_impl._0_8_] = 0x7fffffff;
      rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (var_types,local_1d8._M_impl._0_8_);
      p_Var12 = &local_148;
      if ((*rVar16._M_p & rVar16._M_mask) == 0) {
        p_Var12 = &local_178;
      }
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::erase(p_Var12,(key_type *)&local_1d8);
      std::_Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>::~_Vector_base
                ((_Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_> *)&local_258);
    }
    if (local_27c != 0x7fffffff) {
      iVar5 = randi2((int)((ulong)((long)local_228._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_228._M_impl.super__Vector_impl_data._M_start) >> 3));
      local_270 = local_228._M_impl.super__Vector_impl_data._M_start[iVar5];
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(local_268,&local_270);
      my_set<merlin::edge_id>::my_set
                (&local_198,
                 local_100.m_adj.
                 super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + local_270);
      local_258._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_258._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_258._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_278 = (index *)(ulong)((int)local_278 - 1);
      piVar10 = &(local_198.super_my_vector<merlin::edge_id>.
                  super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                  super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                  super__Vector_impl_data._M_start)->second;
      local_258._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_258._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      for (; p_Var7 = local_258._M_impl.super__Rb_tree_header._M_header._M_left,
          (pointer)(piVar10 + -1) !=
          local_198.super_my_vector<merlin::edge_id>.
          super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
          super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
          super__Vector_impl_data._M_finish; piVar10 = piVar10 + 4) {
        uVar3 = ((pointer)(piVar10 + -1))->first;
        if ((uVar3 == local_270) && (*piVar10 != uVar3)) {
          std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)&local_258,piVar10);
        }
      }
      for (; p_Var8 = p_Var7, (_Rb_tree_header *)p_Var7 != p_Var1;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        while (p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8),
              (_Rb_tree_header *)p_Var8 != p_Var1) {
          graph::add_edge(&local_100,*(index *)(p_Var7 + 1),*(index *)(p_Var8 + 1));
        }
      }
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_Rb_tree(&local_1d8,&local_258);
      for (p_Var9 = local_258._M_impl.super__Rb_tree_header._M_header._M_left;
          pmVar4 = local_100.m_adj.
                   super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
                   ._M_impl.super__Vector_impl_data._M_start, (_Rb_tree_header *)p_Var9 != p_Var1;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        uVar3 = *(unsigned_long *)(p_Var9 + 1);
        for (piVar10 = &(local_100.m_adj.
                         super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar3].
                         super_my_vector<merlin::edge_id>.
                         super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                         super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                         _M_impl.super__Vector_impl_data._M_start)->second;
            (edge_id *)(piVar10 + -1) !=
            pmVar4[uVar3].super_my_vector<merlin::edge_id>.
            super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
            super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
            super__Vector_impl_data._M_finish; piVar10 = piVar10 + 4) {
          if ((((edge_id *)(piVar10 + -1))->first == uVar3) && (uVar3 != *piVar10)) {
            std::
            _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
            ::_M_insert_unique<unsigned_long_const&>
                      ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                        *)&local_1d8,piVar10);
          }
        }
      }
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::erase(&local_1d8,&local_270);
      var_types = local_1a8;
      for (peVar11 = local_198.super_my_vector<merlin::edge_id>.
                     super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                     super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                     super__Vector_impl_data._M_start;
          peVar11 !=
          local_198.super_my_vector<merlin::edge_id>.
          super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
          super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
          super__Vector_impl_data._M_finish; peVar11 = peVar11 + 1) {
        graph::remove_edge(&local_100,peVar11->first,peVar11->second);
      }
      graph::remove_node(&local_100,local_270);
      local_210._M_impl.super__Vector_impl_data._M_start[local_270] = 0x7fffffff;
      rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](var_types,local_270);
      p_Var12 = &local_148;
      if ((*rVar16._M_p & rVar16._M_mask) == 0) {
        p_Var12 = &local_178;
      }
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::erase(p_Var12,&local_270);
      for (p_Var9 = local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != &local_1d8._M_impl.super__Rb_tree_header;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        v = *(size_t *)(p_Var9 + 1);
        iVar5 = order_score(local_1a0,&local_100,v,local_25c);
        local_210._M_impl.super__Vector_impl_data._M_start[v] = iVar5;
      }
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&local_1d8);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&local_258);
      std::_Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>::~_Vector_base
                ((_Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_> *)&local_198);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_1f8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_228);
  } while (local_27c != 0x7fffffff);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_210);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_148);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_178);
  std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::~vector(&local_118);
  graph::~graph(&local_100);
  return local_268;
}

Assistant:

variable_order_t order2(OrderMethod ord_type, std::vector<bool> var_types) const {

		// variable order to be computed
		variable_order_t order;

		// create a temporary graph
		graph G(nvar());
		std::vector<variable_set> adj = mrf();
		for (size_t i = 0; i < nvar(); ++i) {
			variable_set& vs = adj[i];
			for (variable_set::const_iterator vi = vs.begin();
					vi != vs.end(); ++vi) {
				size_t j = _vindex(*vi);
				G.add_edge(i, j);
			}
		}

		// reserve space for the order
		size_t n = nvar();
		order.reserve(n);

		// identify SUM and MAP variables
		std::set<size_t> sum_vars, map_vars;
		for (size_t i = 0; i < n; ++i) {
			if (var_types[i] == false) sum_vars.insert(i);
			else map_vars.insert(i);
		}

		// keeps track of node scores
		std::vector<int> scores(n);
		for (size_t i = 0; i < n; ++i) {
			scores[i] = order_score(G, i, ord_type);
		}

		// eliminate nodes until all gone
		int min_score = -1, num_nodes = n;
		size_t width = 0;
		while (num_nodes != 0) {

			// keeps track of minimal score nodes
			std::vector<size_t> candidates; // minimal score of 1 or higher
			std::vector<size_t> simplicial; // simplicial nodes (score 0)

			min_score = std::numeric_limits<int>::max();

			// check if there are SUM vars left to eliminate
			std::set<size_t>::iterator start, stop;
			if (sum_vars.empty() == false) { // yes
				start = sum_vars.begin();
				stop = sum_vars.end();
			} else { // done, move to MAP vars
				start = map_vars.begin();
				stop = map_vars.end();
			}
			for (std::set<size_t>::iterator si = start; si != stop; ++si) {
				int v = *si;
				if (scores[v] == 0) { // score 0
					simplicial.push_back(v);
				} else if (scores[v] < min_score) { // new, lower score (but greater 0)
					min_score = scores[v];
					candidates.clear();
					candidates.push_back(v);
				} else if (scores[v] == min_score) { // current min. found again
					candidates.push_back(v);
				}
			}

			// eliminate all nodes with score=0 -> no edges will have to be added
			for (std::vector<size_t>::iterator it = simplicial.begin();
					it != simplicial.end(); ++it) {
				size_t v = (*it);
				order.push_back(v);
				--num_nodes;
				my_set<edge_id> temp = G.neighbors(v);
				width = std::max(width, temp.size());
				for (my_set<edge_id>::const_iterator ci = temp.begin();
						ci != temp.end(); ++ci) {
					size_t i = ci->first, j = ci->second;
					G.remove_edge(i, j);
				}
				G.remove_node(v); // and adj edges
				scores[v] = std::numeric_limits<int>::max();
				if (var_types[v] == false) sum_vars.erase(v);
				else map_vars.erase(v);
			}

			// anything left to eliminate? If not, we are done!
			if (min_score == std::numeric_limits<int>::max()) {
				break;
			}

			// Pick one of the minimal score nodes (with score >= 1),
			// breaking ties randomly
			size_t cand = candidates[randi2(candidates.size())];
			//size_t cand = candidates[0]; // first candidate in list (lexicograhically)
			order.push_back(cand);
			--num_nodes;

			// remember it's neighbors, to be used later
			my_set<edge_id> nlist = G.neighbors(cand);
			std::set<size_t> neighbors;
			for (my_set<edge_id>::const_iterator ci = nlist.begin();
					ci != nlist.end(); ++ci) {
				if (ci->first == cand && ci->second != cand)
					neighbors.insert(ci->second);
			}

			// connect neighbors in primal graph
			std::set<size_t>::iterator it1, it2;
			for (it1 = neighbors.begin(); it1 != neighbors.end(); ++it1) {
				it2 = it1;
				while (++it2 != neighbors.end()) {
					size_t i = *it1, j = *it2;
					G.add_edge(i, j);
				}
			}

			// compute candidates for score update (node's neighbors and their neighbors)
			width = std::max(width, neighbors.size());
			std::set<size_t> to_fix(neighbors);
			for (std::set<size_t>::const_iterator it = neighbors.begin();
					it != neighbors.end(); ++it) {
				size_t v = (*it);
				const my_set<edge_id>& temp = G.neighbors(v);
				for (my_set<edge_id>::const_iterator ci = temp.begin();
						ci != temp.end(); ++ci) {
					if (ci->first == v && v != ci->second)
						to_fix.insert(ci->second);
				}
			}
			to_fix.erase(cand);

			// remove node from primal graph
			for (my_set<edge_id>::const_iterator ci = nlist.begin();
					ci != nlist.end(); ++ci) {
				size_t i = ci->first, j = ci->second;
				G.remove_edge(i, j);
			}
			G.remove_node(cand); // and adj edges
			scores[cand] = std::numeric_limits<int>::max(); // tag score
			if (var_types[cand] == false) sum_vars.erase(cand);
			else map_vars.erase(cand);

			// update scores in primal graph (candidate nodes computed earlier)
			for (std::set<size_t>::const_iterator it = to_fix.begin();
					it != to_fix.end(); ++it) {
				size_t v = (*it);
				scores[v] = order_score(G, v, ord_type);
			}
		}

		return order;
	}